

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

void __thiscall
gl3cts::TransformFeedback::CaptureVertexInterleaved::buildProgram(CaptureVertexInterleaved *this)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  GLchar *pGVar1;
  undefined8 gl_00;
  int iVar2;
  GLuint GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  reference pvVar5;
  value_type pcVar6;
  reference ppcVar7;
  TestContext *this_01;
  TestLog *log;
  GLchar *vertex_shader_source;
  undefined4 *puVar8;
  GLint i_00;
  GLint i_01;
  GLint i_02;
  GLint i_03;
  GLint i_04;
  char *this_02;
  string local_348;
  allocator<char> local_321;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  allocator<char> local_211;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  allocator<char> local_109;
  string local_108 [8];
  string varying;
  GLint i;
  GLint all_transform_feedback_interleaved_varyings_count;
  GLint user_defined_transform_feedback_interleaved_varyings_count;
  vector<const_char_*,_std::allocator<const_char_*>_> transform_feedback_varyings_c;
  undefined1 local_b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transform_feedback_varyings;
  string local_98 [8];
  string transform_feedback_variable_setters;
  string local_70 [8];
  string transform_feedback_variable_declarations;
  allocator<char> local_39;
  string local_38 [8];
  string vertex_shader;
  Functions *gl;
  CaptureVertexInterleaved *this_local;
  
  pRVar4 = deqp::Context::getRenderContext(this->m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  pGVar1 = s_vertex_shader_source_code_template;
  vertex_shader.field_2._8_8_ = CONCAT44(extraout_var,iVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,pGVar1,&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"",
             (allocator<char> *)(transform_feedback_variable_setters.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(transform_feedback_variable_setters.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,"",
             (allocator<char> *)
             ((long)&transform_feedback_varyings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&transform_feedback_varyings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  iVar2 = this->m_max_transform_feedback_components;
  this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&transform_feedback_varyings_c.
                       super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_b8,(long)iVar2,this_00);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&transform_feedback_varyings_c.
                        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 7));
  iVar2 = this->m_max_transform_feedback_components;
  std::allocator<const_char_*>::allocator
            ((allocator<const_char_*> *)
             ((long)&all_transform_feedback_interleaved_varyings_count + 3));
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)
             &user_defined_transform_feedback_interleaved_varyings_count,(long)iVar2,
             (allocator<const_char_*> *)
             ((long)&all_transform_feedback_interleaved_varyings_count + 3));
  std::allocator<const_char_*>::~allocator
            ((allocator<const_char_*> *)
             ((long)&all_transform_feedback_interleaved_varyings_count + 3));
  varying.field_2._12_4_ = this->m_max_transform_feedback_components / 4;
  iVar2 = varying.field_2._12_4_ + -1;
  for (varying.field_2._8_4_ = 0; (int)varying.field_2._8_4_ < iVar2;
      varying.field_2._8_4_ = varying.field_2._8_4_ + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_108,"result_",&local_109);
    std::allocator<char>::~allocator(&local_109);
    Utilities::itoa_abi_cxx11_(&local_130,(Utilities *)(ulong)(uint)varying.field_2._8_4_,i_00);
    std::__cxx11::string::append(local_108);
    std::__cxx11::string::~string((string *)&local_130);
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_b8,(long)(int)varying.field_2._8_4_);
    std::__cxx11::string::operator=((string *)pvVar5,local_108);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_b8,(long)(int)varying.field_2._8_4_);
    pcVar6 = (value_type)std::__cxx11::string::c_str();
    ppcVar7 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                         &user_defined_transform_feedback_interleaved_varyings_count,
                         (long)(int)varying.field_2._8_4_);
    *ppcVar7 = pcVar6;
    std::__cxx11::string::append((char *)local_70);
    std::__cxx11::string::append(local_70);
    std::__cxx11::string::append((char *)local_70);
    std::__cxx11::string::append((char *)local_98);
    std::__cxx11::string::append(local_98);
    std::__cxx11::string::append((char *)local_98);
    Utilities::itoa_abi_cxx11_
              (&local_150,(Utilities *)(ulong)(uint)(varying.field_2._8_4_ << 2),i_01);
    std::__cxx11::string::append(local_98);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::append((char *)local_98);
    Utilities::itoa_abi_cxx11_(&local_170,(Utilities *)(ulong)(varying.field_2._8_4_ * 4 + 1),i_02);
    std::__cxx11::string::append(local_98);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::append((char *)local_98);
    Utilities::itoa_abi_cxx11_(&local_190,(Utilities *)(ulong)(varying.field_2._8_4_ * 4 + 2),i_03);
    std::__cxx11::string::append(local_98);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::append((char *)local_98);
    Utilities::itoa_abi_cxx11_(&local_1b0,(Utilities *)(ulong)(varying.field_2._8_4_ * 4 + 3),i_04);
    std::__cxx11::string::append(local_98);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::append((char *)local_98);
    std::__cxx11::string::~string(local_108);
  }
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_b8,(long)iVar2);
  std::__cxx11::string::operator=((string *)pvVar5,"gl_Position");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_b8,(long)iVar2);
  pcVar6 = (value_type)std::__cxx11::string::c_str();
  ppcVar7 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                       &user_defined_transform_feedback_interleaved_varyings_count,(long)iVar2);
  *ppcVar7 = pcVar6;
  std::__cxx11::string::string((string *)&local_1f0,local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"TEMPLATE_INPUT_OUTPUT_DECLARATIONS",&local_211);
  std::__cxx11::string::string((string *)&local_238,local_70);
  Utilities::preprocessCode(&local_1d0,&local_1f0,&local_210,&local_238);
  std::__cxx11::string::operator=(local_38,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::string((string *)&local_278,local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"TEMPLATE_OUTPUT_SETTERS",&local_299);
  std::__cxx11::string::string((string *)&local_2c0,local_98);
  Utilities::preprocessCode(&local_258,&local_278,&local_298,&local_2c0);
  std::__cxx11::string::operator=(local_38,(string *)&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::string((string *)&local_300,local_38);
  std::allocator<char>::allocator();
  this_02 = "TEMPLATE_RASTERIZATION_EPSILON";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_320,"TEMPLATE_RASTERIZATION_EPSILON",&local_321);
  Utilities::ftoa_abi_cxx11_(&local_348,(Utilities *)this_02,0.0625);
  Utilities::preprocessCode(&local_2e0,&local_300,&local_320,&local_348);
  std::__cxx11::string::operator=(local_38,(string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator(&local_321);
  std::__cxx11::string::~string((string *)&local_300);
  gl_00 = vertex_shader.field_2._8_8_;
  this_01 = deqp::Context::getTestContext(this->m_context);
  log = tcu::TestContext::getLog(this_01);
  vertex_shader_source = (GLchar *)std::__cxx11::string::c_str();
  pGVar1 = s_fragment_shader_source_code;
  ppcVar7 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                       &user_defined_transform_feedback_interleaved_varyings_count,0);
  GVar3 = Utilities::buildProgram
                    ((Functions *)gl_00,log,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,
                     vertex_shader_source,pGVar1,ppcVar7,varying.field_2._12_4_,this->m_attrib_type,
                     false,(GLint *)0x0);
  this->m_program = GVar3;
  if (this->m_program == 0) {
    puVar8 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar8 = 0;
    __cxa_throw(puVar8,&int::typeinfo,0);
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)
             &user_defined_transform_feedback_interleaved_varyings_count);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_b8);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void gl3cts::TransformFeedback::CaptureVertexInterleaved::buildProgram(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Preparing source code. */
	std::string vertex_shader(s_vertex_shader_source_code_template); /* Storage for vertex shader source code. */
	std::string transform_feedback_variable_declarations(
		""); /* String to contain all custom outputs from vertex shader. */
	std::string transform_feedback_variable_setters(
		""); /* String containing all initializations of custom outputs from vertex shader. */
	std::vector<std::string> transform_feedback_varyings(m_max_transform_feedback_components); /* Varyings array. */
	std::vector<const glw::GLchar*> transform_feedback_varyings_c(
		m_max_transform_feedback_components); /* Varyings array in C form to pass to the GL. */

	glw::GLint user_defined_transform_feedback_interleaved_varyings_count =
		m_max_transform_feedback_components /* total max to be written by the shader */
			/ 4								/* components per vec4 */
		- 1 /* gl_Position */;

	glw::GLint all_transform_feedback_interleaved_varyings_count =
		user_defined_transform_feedback_interleaved_varyings_count + 1 /* gl_Position */;

	/* Most of varyings is declarated output variables. */
	for (glw::GLint i = 0; i < user_defined_transform_feedback_interleaved_varyings_count; ++i)
	{
		std::string varying = "result_";
		varying.append(gl3cts::TransformFeedback::Utilities::itoa(i));

		transform_feedback_varyings[i] = varying;

		transform_feedback_varyings_c[i] = transform_feedback_varyings[i].c_str();

		transform_feedback_variable_declarations.append("out vec4 ");
		transform_feedback_variable_declarations.append(varying);
		transform_feedback_variable_declarations.append(";\n");

		transform_feedback_variable_setters.append("    ");
		transform_feedback_variable_setters.append(varying);
		transform_feedback_variable_setters.append(" = vec4(");
		transform_feedback_variable_setters.append(gl3cts::TransformFeedback::Utilities::itoa(i * 4));
		transform_feedback_variable_setters.append(".0, ");
		transform_feedback_variable_setters.append(gl3cts::TransformFeedback::Utilities::itoa(i * 4 + 1));
		transform_feedback_variable_setters.append(".0, ");
		transform_feedback_variable_setters.append(gl3cts::TransformFeedback::Utilities::itoa(i * 4 + 2));
		transform_feedback_variable_setters.append(".0, ");
		transform_feedback_variable_setters.append(gl3cts::TransformFeedback::Utilities::itoa(i * 4 + 3));
		transform_feedback_variable_setters.append(".0);\n");
	}

	/* Last four varying components are gl_Position components. */
	transform_feedback_varyings[user_defined_transform_feedback_interleaved_varyings_count] = "gl_Position";

	transform_feedback_varyings_c[user_defined_transform_feedback_interleaved_varyings_count] =
		transform_feedback_varyings[user_defined_transform_feedback_interleaved_varyings_count].c_str();

	/* Preprocess vertex shader source code template. */
	vertex_shader = gl3cts::TransformFeedback::Utilities::preprocessCode(
		vertex_shader, "TEMPLATE_INPUT_OUTPUT_DECLARATIONS", transform_feedback_variable_declarations);
	vertex_shader = gl3cts::TransformFeedback::Utilities::preprocessCode(vertex_shader, "TEMPLATE_OUTPUT_SETTERS",
																		 transform_feedback_variable_setters);
	vertex_shader = gl3cts::TransformFeedback::Utilities::preprocessCode(
		vertex_shader, "TEMPLATE_RASTERIZATION_EPSILON",
		gl3cts::TransformFeedback::Utilities::ftoa(s_rasterization_epsilon));

	/* Compile, link and check. */
	m_program = gl3cts::TransformFeedback::Utilities::buildProgram(
		gl, m_context.getTestContext().getLog(), NULL, NULL, NULL, vertex_shader.c_str(), s_fragment_shader_source_code,
		&transform_feedback_varyings_c[0], all_transform_feedback_interleaved_varyings_count, m_attrib_type);

	if (0 == m_program)
	{
		throw 0;
	}
}